

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndirectObjectsReferenceRegistry.cpp
# Opt level: O2

EStatusCode __thiscall
IndirectObjectsReferenceRegistry::ReadState
          (IndirectObjectsReferenceRegistry *this,PDFParser *inStateReader,ObjectIDType inObjectID)

{
  pointer pOVar1;
  PDFObject *pPVar2;
  PDFDictionary *pPVar3;
  longlong lVar4;
  PDFObjectCastPtr<PDFInteger> objectReferenceType;
  PDFObjectCastPtr<PDFDictionary> objectWriteInformationDictionary;
  PDFObjectCastPtr<PDFBoolean> objectDirty;
  PDFObjectCastPtr<PDFInteger> generationNumber;
  PDFObjectCastPtr<PDFBoolean> objectWritten;
  PDFObjectCastPtr<PDFArray> objectsWritesRegistry;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> it;
  PDFObjectCastPtr<PDFDictionary> indirectObjectsDictionary;
  ObjectWriteInformation newObjectInformation;
  allocator<char> local_1a9;
  RefCountPtr<PDFInteger> local_1a8;
  RefCountPtr<PDFDictionary> local_198;
  RefCountPtr<PDFBoolean> local_188;
  RefCountPtr<PDFInteger> local_178;
  RefCountPtr<PDFBoolean> local_168;
  RefCountPtr<PDFArray> local_158;
  IndirectObjectsReferenceRegistry *local_148;
  PDFParser *local_140;
  long *local_138;
  char local_130;
  long *local_128;
  RefCountPtr<PDFDictionary> local_120;
  value_type local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_140 = inStateReader;
  pPVar2 = PDFParser::ParseNewObject(inStateReader,inObjectID);
  pPVar3 = PDFObjectCast<PDFDictionary>(pPVar2);
  local_120._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d8c0;
  local_120.mValue = pPVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"mObjectsWritesRegistry",(allocator<char> *)&local_110);
  pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_f0);
  local_158.mValue = PDFObjectCast<PDFArray>(pPVar2);
  local_158._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d8f8;
  std::__cxx11::string::~string((string *)&local_f0);
  PDFArray::GetIterator(local_158.mValue);
  pOVar1 = (this->mObjectsWritesRegistry).
           super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mObjectsWritesRegistry).
      super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>._M_impl.
      super__Vector_impl_data._M_finish != pOVar1) {
    (this->mObjectsWritesRegistry).
    super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>._M_impl.
    super__Vector_impl_data._M_finish = pOVar1;
  }
  local_148 = this;
  while( true ) {
    if (local_128 == local_138) break;
    if (local_130 == '\x01') {
      local_130 = '\0';
    }
    else {
      local_128 = local_128 + 1;
      if (local_128 == local_138) break;
    }
    pPVar2 = PDFParser::ParseNewObject(local_140,*(ObjectIDType *)(*local_128 + 0x48));
    pPVar3 = PDFObjectCast<PDFDictionary>(pPVar2);
    local_198._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d8c0;
    local_198.mValue = pPVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"mObjectWritten",(allocator<char> *)&local_1a8);
    pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_d0);
    local_168.mValue = PDFObjectCast<PDFBoolean>(pPVar2);
    local_168._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036f128;
    std::__cxx11::string::~string((string *)&local_d0);
    local_110.mObjectWritten = PDFBoolean::GetValue(local_168.mValue);
    pPVar3 = local_198.mValue;
    if (local_110.mObjectWritten) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"mWritePosition",(allocator<char> *)&local_188);
      pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_50);
      local_1a8.mValue = PDFObjectCast<PDFInteger>(pPVar2);
      local_1a8._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036f160;
      std::__cxx11::string::~string((string *)&local_50);
      local_110.mWritePosition = PDFInteger::GetValue(local_1a8.mValue);
      RefCountPtr<PDFInteger>::~RefCountPtr(&local_1a8);
    }
    pPVar3 = local_198.mValue;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"mObjectReferenceType",(allocator<char> *)&local_188);
    pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_70);
    local_1a8.mValue = PDFObjectCast<PDFInteger>(pPVar2);
    local_1a8._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036f160;
    std::__cxx11::string::~string((string *)&local_70);
    lVar4 = PDFInteger::GetValue(local_1a8.mValue);
    pPVar3 = local_198.mValue;
    local_110.mObjectReferenceType = (EObjectReferenceType)lVar4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"mIsDirty",(allocator<char> *)&local_178);
    pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_90);
    local_188.mValue = PDFObjectCast<PDFBoolean>(pPVar2);
    local_188._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036f128;
    std::__cxx11::string::~string((string *)&local_90);
    local_110.mIsDirty = PDFBoolean::GetValue(local_188.mValue);
    pPVar3 = local_198.mValue;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"mGenerationNumber",&local_1a9);
    pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_b0);
    local_178.mValue = PDFObjectCast<PDFInteger>(pPVar2);
    local_178._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036f160;
    std::__cxx11::string::~string((string *)&local_b0);
    local_110.mGenerationNumber = PDFInteger::GetValue(local_178.mValue);
    std::vector<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>::push_back
              (&local_148->mObjectsWritesRegistry,&local_110);
    RefCountPtr<PDFInteger>::~RefCountPtr(&local_178);
    RefCountPtr<PDFBoolean>::~RefCountPtr(&local_188);
    RefCountPtr<PDFInteger>::~RefCountPtr(&local_1a8);
    RefCountPtr<PDFBoolean>::~RefCountPtr(&local_168);
    RefCountPtr<PDFDictionary>::~RefCountPtr(&local_198);
  }
  RefCountPtr<PDFArray>::~RefCountPtr(&local_158);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_120);
  return eSuccess;
}

Assistant:

EStatusCode IndirectObjectsReferenceRegistry::ReadState(PDFParser* inStateReader,ObjectIDType inObjectID)
{
	PDFObjectCastPtr<PDFDictionary> indirectObjectsDictionary(inStateReader->ParseNewObject(inObjectID));

	PDFObjectCastPtr<PDFArray> objectsWritesRegistry(indirectObjectsDictionary->QueryDirectObject("mObjectsWritesRegistry"));

	SingleValueContainerIterator<PDFObjectVector> it = objectsWritesRegistry->GetIterator();

	mObjectsWritesRegistry.clear();
	while(it.MoveNext())
	{
		ObjectWriteInformation newObjectInformation;
		PDFObjectCastPtr<PDFDictionary> objectWriteInformationDictionary(inStateReader->ParseNewObject(
																				((PDFIndirectObjectReference*)it.GetItem())->mObjectID));
		
		PDFObjectCastPtr<PDFBoolean> objectWritten(objectWriteInformationDictionary->QueryDirectObject("mObjectWritten"));

		newObjectInformation.mObjectWritten = objectWritten->GetValue();

		if(newObjectInformation.mObjectWritten)
		{
			PDFObjectCastPtr<PDFInteger> writePosition(objectWriteInformationDictionary->QueryDirectObject("mWritePosition"));
			newObjectInformation.mWritePosition = writePosition->GetValue();
		}

		PDFObjectCastPtr<PDFInteger> objectReferenceType(objectWriteInformationDictionary->QueryDirectObject("mObjectReferenceType"));
		newObjectInformation.mObjectReferenceType = (ObjectWriteInformation::EObjectReferenceType)objectReferenceType->GetValue();

		PDFObjectCastPtr<PDFBoolean> objectDirty(objectWriteInformationDictionary->QueryDirectObject("mIsDirty"));
        newObjectInformation.mIsDirty = objectDirty->GetValue();
        
        PDFObjectCastPtr<PDFInteger> generationNumber(objectWriteInformationDictionary->QueryDirectObject("mGenerationNumber"));
        newObjectInformation.mGenerationNumber = (unsigned long)generationNumber->GetValue();

		mObjectsWritesRegistry.push_back(newObjectInformation);
	}

	return PDFHummus::eSuccess;
}